

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O1

void xc_lda_sanity_check(xc_func_info_type *info,int order,xc_lda_out_params *out)

{
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  
  lVar1 = CONCAT44(in_register_00000034,order);
  if ((uint)order < 5) {
    if ((out->zk != (double *)0x0) && ((info->flags & 1) == 0)) goto LAB_0064c492;
    if ((out->vrho != (double *)0x0) && ((info->flags & 2) == 0)) goto LAB_0064c497;
    if ((out->v2rho2 == (double *)0x0) || ((info->flags & 4) != 0)) {
      if ((out->v3rho3 == (double *)0x0) || ((info->flags & 8) != 0)) {
        return;
      }
      goto LAB_0064c4a1;
    }
  }
  else {
    info = (xc_func_info_type *)(ulong)(uint)order;
    xc_lda_sanity_check_cold_5();
LAB_0064c492:
    xc_lda_sanity_check_cold_1();
LAB_0064c497:
    xc_lda_sanity_check_cold_2();
  }
  xc_lda_sanity_check_cold_3();
LAB_0064c4a1:
  xc_lda_sanity_check_cold_4();
  if ((void *)*extraout_RDX != (void *)0x0) {
    memset((void *)*extraout_RDX,0,*(int *)&(info->ext_params).names * lVar1 * 8);
  }
  if ((void *)extraout_RDX[1] != (void *)0x0) {
    memset((void *)extraout_RDX[1],0,*(int *)((long)&(info->ext_params).names + 4) * lVar1 * 8);
  }
  if ((void *)extraout_RDX[2] != (void *)0x0) {
    memset((void *)extraout_RDX[2],0,*(int *)((long)&(info->ext_params).values + 4) * lVar1 * 8);
  }
  if ((void *)extraout_RDX[3] != (void *)0x0) {
    memset((void *)extraout_RDX[3],0,*(int *)((long)&info->gga + 4) * lVar1 * 8);
  }
  if ((void *)extraout_RDX[4] != (void *)0x0) {
    memset((void *)extraout_RDX[4],0,lVar1 * *(int *)&info[1].field_0x44 * 8);
    return;
  }
  return;
}

Assistant:

void
xc_lda_sanity_check(const xc_func_info_type *info, int order, xc_lda_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }

  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL && !(info->flags & XC_FLAGS_HAVE_VXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
	    info->name);
    exit(1);
  }

  if(out->v2rho2 != NULL && !(info->flags & XC_FLAGS_HAVE_FXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
	    info->name);
    exit(1);
  }

  if(out->v3rho3 != NULL && !(info->flags & XC_FLAGS_HAVE_KXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
	    info->name);
    exit(1);
  }
}